

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mir.c
# Opt level: O0

MIR_reg_t vn_add_val(MIR_context_t ctx,MIR_func_t func,MIR_type_t type,MIR_insn_code_t code,
                    MIR_op_t op1,MIR_op_t op2)

{
  undefined1 auVar1 [48];
  val_t el;
  val_t el_00;
  undefined1 auVar2 [64];
  int iVar3;
  undefined1 auVar4 [64];
  undefined1 auVar5 [64];
  undefined1 auVar6 [64];
  undefined1 local_128 [8];
  val_t tab_val;
  val_t val;
  MIR_insn_code_t code_local;
  MIR_type_t type_local;
  MIR_func_t func_local;
  MIR_context_t ctx_local;
  
  tab_val._120_4_ = code;
  tab_val._124_4_ = type;
  val._120_4_ = code;
  val._124_4_ = type;
  memcpy(&val.field_0x8,&op1,0x30);
  memcpy((void *)((long)&val.op1.u + 0x18),&op2,0x30);
  auVar5._4_4_ = tab_val._124_4_;
  auVar5._0_4_ = tab_val._120_4_;
  auVar5._8_56_ = (undefined1  [56])val._0_56_;
  auVar4 = vmovdqu64_avx512f(auVar5);
  auVar6._48_4_ = val.op2.u.mem.disp._0_4_;
  auVar6._0_48_ = (undefined1  [48])val._56_48_;
  auVar6._52_12_ = (undefined1  [12])val._108_12_;
  auVar5 = vmovdqu64_avx512f(auVar6);
  auVar5 = vmovdqu64_avx512f(auVar5);
  auVar6 = vmovdqu64_avx512f(auVar4);
  auVar1 = auVar5._0_48_;
  el.op2.data = (void *)auVar1._0_8_;
  el.op2._8_8_ = auVar1._8_8_;
  el.op2.u = (anon_union_32_12_57d33f68_for_u)auVar1._16_32_;
  el.reg = auVar5._48_4_;
  el._116_8_ = auVar5._52_8_;
  el._124_4_ = auVar5._60_4_;
  auVar1 = auVar6._16_48_;
  el.code = auVar6._0_4_;
  el.type = auVar6._4_4_;
  el._8_8_ = auVar6._8_8_;
  el.op1.data = (void *)auVar1._0_8_;
  el.op1._8_8_ = auVar1._8_8_;
  el.op1.u = (anon_union_32_12_57d33f68_for_u)auVar1._16_32_;
  iVar3 = HTAB_val_t_do(ctx->simplify_ctx->val_tab,el,HTAB_FIND,(val_t *)local_128);
  if (iVar3 == 0) {
    val.op2.u.mem.disp._0_4_ = new_temp_reg(ctx,val._124_4_,func);
    auVar4._4_4_ = tab_val._124_4_;
    auVar4._0_4_ = tab_val._120_4_;
    auVar4._8_56_ = (undefined1  [56])val._0_56_;
    auVar6 = vmovdqu64_avx512f(auVar4);
    auVar2._48_4_ = val.op2.u.mem.disp._0_4_;
    auVar2._0_48_ = (undefined1  [48])val._56_48_;
    auVar2._52_12_ = (undefined1  [12])val._108_12_;
    auVar5 = vmovdqu64_avx512f(auVar2);
    auVar5 = vmovdqu64_avx512f(auVar5);
    auVar6 = vmovdqu64_avx512f(auVar6);
    auVar1 = auVar5._0_48_;
    el_00.op2.data = (void *)auVar1._0_8_;
    el_00.op2._8_8_ = auVar1._8_8_;
    el_00.op2.u = (anon_union_32_12_57d33f68_for_u)auVar1._16_32_;
    el_00.reg = auVar5._48_4_;
    el_00._116_8_ = auVar5._52_8_;
    el_00._124_4_ = auVar5._60_4_;
    auVar1 = auVar6._16_48_;
    el_00.code = auVar6._0_4_;
    el_00.type = auVar6._4_4_;
    el_00._8_8_ = auVar6._8_8_;
    el_00.op1.data = (void *)auVar1._0_8_;
    el_00.op1._8_8_ = auVar1._8_8_;
    el_00.op1.u = (anon_union_32_12_57d33f68_for_u)auVar1._16_32_;
    HTAB_val_t_do(ctx->simplify_ctx->val_tab,el_00,HTAB_INSERT,(val_t *)local_128);
    ctx_local._4_4_ = val.op2.u.mem.disp._0_4_;
  }
  else {
    ctx_local._4_4_ = tab_val.op2.u.mem.disp._0_4_;
  }
  return ctx_local._4_4_;
}

Assistant:

static MIR_reg_t vn_add_val (MIR_context_t ctx, MIR_func_t func, MIR_type_t type,
                             MIR_insn_code_t code, MIR_op_t op1, MIR_op_t op2) {
  val_t val, tab_val;

  val.type = type;
  val.code = code;
  val.op1 = op1;
  val.op2 = op2;
  if (HTAB_DO (val_t, val_tab, val, HTAB_FIND, tab_val)) return tab_val.reg;
  val.reg = new_temp_reg (ctx, type, func);
  HTAB_DO (val_t, val_tab, val, HTAB_INSERT, tab_val);
  return val.reg;
}